

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Instr * __thiscall IR::Instr::GetNextByteCodeInstr(Instr *this)

{
  code *pcVar1;
  uint32 uVar2;
  undefined4 *puVar3;
  bool bVar4;
  anon_class_1_0_00000001 local_1d;
  uint32 local_1c;
  anon_class_1_0_00000001 getNext;
  Instr *pIStack_18;
  uint32 currentOffset;
  Instr *nextInstr;
  Instr *this_local;
  
  pIStack_18 = GetNextRealInstrOrLabel(this);
  local_1c = GetByteCodeOffset(this);
  while( true ) {
    uVar2 = GetByteCodeOffset(pIStack_18);
    bVar4 = true;
    if (uVar2 != 0xffffffff) {
      uVar2 = GetByteCodeOffset(pIStack_18);
      bVar4 = uVar2 == local_1c;
    }
    if (!bVar4) break;
    pIStack_18 = GetNextByteCodeInstr::anon_class_1_0_00000001::operator()(&local_1d,pIStack_18);
  }
  if (local_1c == 0xffffffff) {
    uVar2 = GetByteCodeOffset(pIStack_18);
    if (uVar2 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xb27,"(nextInstr->GetByteCodeOffset() == 0)",
                         "Only instrs before the first one are allowed to not have a bytecode offset"
                        );
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  else {
    while( true ) {
      uVar2 = GetByteCodeOffset(pIStack_18);
      bVar4 = true;
      if (uVar2 != 0xffffffff) {
        uVar2 = GetByteCodeOffset(pIStack_18);
        bVar4 = uVar2 < local_1c;
      }
      if (!bVar4) break;
      pIStack_18 = GetNextByteCodeInstr::anon_class_1_0_00000001::operator()(&local_1d,pIStack_18);
    }
  }
  return pIStack_18;
}

Assistant:

IR::Instr *
Instr::GetNextByteCodeInstr() const
{
    IR::Instr * nextInstr = GetNextRealInstrOrLabel();
    uint32 currentOffset = GetByteCodeOffset();
    const auto getNext = [](IR::Instr* nextInstr) -> IR::Instr*
    {
        if (nextInstr->IsBranchInstr())
        {
            IR::BranchInstr* branchInstr = nextInstr->AsBranchInstr();
            AssertMsg(branchInstr->IsUnconditional(), "We can't know which branch to take on a conditionnal branch");
            if (branchInstr->IsUnconditional())
            {
                return branchInstr->GetTarget();
            }
        }
        return nextInstr->GetNextRealInstrOrLabel();
    };
    while (nextInstr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset ||
        nextInstr->GetByteCodeOffset() == currentOffset)
    {
        nextInstr = getNext(nextInstr);
    }

    // Do not check if the instr trying to bailout is in the function prologue
    // nextInstr->GetByteCodeOffset() < currentOffset would always be true and we would crash
    if (currentOffset != Js::Constants::NoByteCodeOffset)
    {
        // This can happen due to break block removal
        while (nextInstr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset ||
            nextInstr->GetByteCodeOffset() < currentOffset)
        {
            nextInstr = getNext(nextInstr);
        }
    }
    else
    {
        AssertMsg(nextInstr->GetByteCodeOffset() == 0, "Only instrs before the first one are allowed to not have a bytecode offset");
    }
    return nextInstr;
}